

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__gl_hook_abstract
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  gl_hook_abstract__AttributeData *pgVar4;
  char **ppcVar5;
  StackMemoryManager *this_00;
  xmlChar **ppxVar6;
  
  pgVar4 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::gl_hook_abstract__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar6 = attributes->attributes;
  if (ppxVar6 != (xmlChar **)0x0) {
    this_00 = &(this->
               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               ).super_ParserTemplateBase.mStackMemoryManager;
    for (; pcVar1 = *ppxVar6, pcVar1 != (char *)0x0; ppxVar6 = ppxVar6 + 2) {
      pcVar2 = ppxVar6[1];
      if ((pgVar4->unknownAttributes).data == (char **)0x0) {
        ppcVar5 = (char **)GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
      }
      else {
        ppcVar5 = (char **)GeneratedSaxParser::StackMemoryManager::growObject(this_00,0x10);
      }
      (pgVar4->unknownAttributes).data = ppcVar5;
      sVar3 = (pgVar4->unknownAttributes).size;
      ppcVar5[sVar3] = pcVar1;
      (pgVar4->unknownAttributes).data[sVar3 + 1] = pcVar2;
      (pgVar4->unknownAttributes).size = sVar3 + 2;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__gl_hook_abstract( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__gl_hook_abstract( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

gl_hook_abstract__AttributeData* attributeData = newData<gl_hook_abstract__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
}


    return true;
}